

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthBasePort.cpp
# Opt level: O1

bool __thiscall
EthBasePort::ReceiveResponseNode
          (EthBasePort *this,nodeid_t node,quadlet_t *rdata,uint nbytes,uint8_t fw_tl,
          nodeid_t *src_node)

{
  bool bVar1;
  uint i;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  ostream *poVar8;
  quadlet_t *qp;
  uchar *puVar9;
  uint uVar10;
  uchar *puVar11;
  
  puVar11 = (this->super_BasePort).GenericBuffer;
  uVar2 = (*(this->super_BasePort)._vptr_BasePort[0x18])();
  iVar3 = (*(this->super_BasePort)._vptr_BasePort[0x14])(this,4);
  iVar4 = (*(this->super_BasePort)._vptr_BasePort[0x16])(this);
  uVar10 = iVar4 + iVar3 + nbytes;
  uVar5 = (*(this->super_BasePort)._vptr_BasePort[0x18])(this);
  uVar6 = (*(this->super_BasePort)._vptr_BasePort[0x14])(this,4);
  puVar9 = (this->super_BasePort).ReadBufferBroadcast;
  puVar11 = puVar11 + uVar2;
  if ((uchar *)((long)rdata + (-(ulong)uVar6 - (ulong)uVar5)) == puVar9) {
    puVar11 = puVar9;
  }
  uVar2 = (*(this->super_BasePort)._vptr_BasePort[0x2e])(this,puVar11,(ulong)uVar10);
  if (uVar2 == uVar10) {
    ProcessExtraData(this,puVar11 + ((ulong)uVar10 - 8));
    bVar1 = false;
    iVar3 = (*(this->super_BasePort)._vptr_BasePort[0x32])(this,puVar11,0);
    if ((char)iVar3 != '\0') {
      uVar2 = (*(this->super_BasePort)._vptr_BasePort[0x14])(this,3);
      puVar9 = puVar11 + uVar2;
      lVar7 = 0;
      do {
        uVar2 = *(uint *)(puVar9 + lVar7 * 4);
        *(uint *)(puVar9 + lVar7 * 4) =
             uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 5);
      bVar1 = CheckFirewirePacket(this,puVar9,(ulong)nbytes,node,7,(uint)fw_tl);
      if (bVar1) {
        if (src_node != (nodeid_t *)0x0) {
          *src_node = *(ushort *)(puVar9 + 6) & 0x3f;
        }
        uVar2 = (*(this->super_BasePort)._vptr_BasePort[0x14])(this,4);
        if ((quadlet_t *)(puVar11 + uVar2) != rdata) {
          (this->super_BasePort).rtRead = false;
          memcpy(rdata,puVar11 + uVar2,(ulong)nbytes);
        }
      }
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((this->super_BasePort).outStr,"ReadBlock: failed to receive read response",0x2a);
    if ((this->super_BasePort).Node2Board[node] < 0x10) {
      poVar8 = (this->super_BasePort).outStr;
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," from board ",0xc);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    }
    poVar8 = (this->super_BasePort).outStr;
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,": return value = ",0x11);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,uVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,", expected = ",0xd);
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool EthBasePort::ReceiveResponseNode(nodeid_t node, quadlet_t *rdata,
                                      unsigned int nbytes, uint8_t fw_tl, nodeid_t *src_node)
{
    // Packet to receive
    unsigned char *packet = GenericBuffer+GetReadQuadAlign();;
    unsigned int packetSize = GetPrefixOffset(RD_FW_BDATA) + nbytes + GetReadPostfixSize();

    // Check for real-time read
    unsigned char *rdata_base = reinterpret_cast<unsigned char *>(rdata)-GetReadQuadAlign()-GetPrefixOffset(RD_FW_BDATA);
    if (rdata_base == ReadBufferBroadcast) {
        packet = ReadBufferBroadcast;
    }

    int nRecv = PacketReceive(packet, packetSize);
    if (nRecv != static_cast<int>(packetSize)) {
        outStr << "ReadBlock: failed to receive read response";
        unsigned char boardId = Node2Board[node];
        if (boardId < BoardIO::MAX_BOARDS)
            outStr << " from board " << static_cast<unsigned int>(boardId);
        outStr << ": return value = " << nRecv
               << ", expected = " << packetSize << std::endl;
        return false;
    }

    ProcessExtraData(packet+packetSize-FW_EXTRA_SIZE);

    if (!CheckEthernetHeader(packet, false))
        return false;
    // Byteswap Firewire header
    unsigned char *packetFw = packet + GetPrefixOffset(RD_FW_HEADER);
    ByteswapQuadlets(packetFw, FW_BRESPONSE_HEADER_SIZE);
    if (!CheckFirewirePacket(packetFw, nbytes, node, EthBasePort::BRESPONSE, fw_tl))
        return false;
    if (src_node)
        GetFirewireHeaderInfo(packetFw, src_node, 0, 0);

    const quadlet_t *packet_data = reinterpret_cast<const quadlet_t *>(packet+GetPrefixOffset(RD_FW_BDATA));
    if (rdata != packet_data) {
        rtRead = false;
        memcpy(rdata, packet_data, nbytes);
    }
    return true;
}